

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::OffsetValidator::validateSingleVariable
          (OffsetValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  bool bVar1;
  DataType dataType;
  const_reference pvVar2;
  VarType *this_00;
  InterfaceBlock *pIVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  bool local_692;
  allocator<char> local_691;
  string local_690;
  MessageBuilder local_670;
  MessageBuilder local_4f0;
  allocator<char> local_369;
  string local_368;
  MessageBuilder local_348;
  MessageBuilder local_1b8;
  bool local_32;
  byte local_31;
  bool isBufferBackedBlockStorage;
  string *psStack_30;
  bool isAtomicCounterUniform;
  string *implementationName_local;
  string *psStack_20;
  GLint propValue_local;
  string *resource_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  OffsetValidator *this_local;
  
  psStack_30 = implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_20 = resource;
  resource_local = (string *)path;
  path_local = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *)this;
  pvVar2 = std::
           vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           ::back(path);
  this_00 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(pvVar2);
  dataType = glu::VarType::getBasicType(this_00);
  local_31 = glu::isDataTypeAtomicCounter(dataType);
  pvVar2 = std::
           vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           ::front((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                    *)resource_local);
  bVar1 = ProgramInterfaceDefinition::VariablePathComponent::isInterfaceBlock(pvVar2);
  local_692 = false;
  if (bVar1) {
    pvVar2 = std::
             vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             ::front((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                      *)resource_local);
    pIVar3 = ProgramInterfaceDefinition::VariablePathComponent::getInterfaceBlock(pvVar2);
    local_692 = isBufferBackedInterfaceBlockStorage(pIVar3->storage);
  }
  local_32 = local_692;
  if (((local_31 & 1) == 0) && (local_692 == false)) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1b8,(char (*) [31])"Verifying offset, expecting -1");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    if (implementationName_local._4_4_ != -1) {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_348,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_348,(char (*) [29])"\tError, invalid offset, got ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)((long)&implementationName_local + 4));
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_348);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_368,"offset invalid",&local_369);
      PropValidator::setError((PropValidator *)this,&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator(&local_369);
    }
  }
  else {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_4f0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_4f0,(char (*) [43])"Verifying offset, expecting a valid offset");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4f0);
    if (implementationName_local._4_4_ < 0) {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_670,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_670,(char (*) [29])"\tError, invalid offset, got ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)((long)&implementationName_local + 4));
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_670);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_690,"offset invalid",&local_691);
      PropValidator::setError((PropValidator *)this,&local_690);
      std::__cxx11::string::~string((string *)&local_690);
      std::allocator<char>::~allocator(&local_691);
    }
  }
  return;
}

Assistant:

void OffsetValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const bool isAtomicCounterUniform		= glu::isDataTypeAtomicCounter(path.back().getVariableType()->getBasicType());
	const bool isBufferBackedBlockStorage	= path.front().isInterfaceBlock() && isBufferBackedInterfaceBlockStorage(path.front().getInterfaceBlock()->storage);

	DE_UNREF(resource);
	DE_UNREF(implementationName);

	if (!isAtomicCounterUniform && !isBufferBackedBlockStorage)
	{
		// Not buffer backed
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying offset, expecting -1" << tcu::TestLog::EndMessage;

		if (propValue != -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid offset, got " << propValue << tcu::TestLog::EndMessage;
			setError("offset invalid");
		}
	}
	else
	{
		// Expect a valid offset
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying offset, expecting a valid offset" << tcu::TestLog::EndMessage;

		if (propValue < 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid offset, got " << propValue << tcu::TestLog::EndMessage;
			setError("offset invalid");
		}
	}
}